

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O0

int ConnectMT(MT *pMT,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  undefined4 local_944;
  undefined2 local_93e;
  uInt_MT OutputSettings;
  uchar local_938 [2];
  uShort_MT OutputMode;
  int nbdatabytes;
  uchar databuf [2048];
  uchar gotomeasurementbuf [5];
  uchar reqconfigurationbuf [5];
  uchar gotoconfigbuf [5];
  char line [256];
  FILE *file;
  char *szCfgFilePath_local;
  MT *pMT_local;
  
  stack0xfffffffffffffed3 = 0x30fffa;
  reqconfigurationbuf[1] = '\0';
  stack0xfffffffffffffece = 0xcfffa;
  gotomeasurementbuf[1] = '\0';
  databuf[0x7f9] = 0xfa;
  databuf[0x7fa] = 0xff;
  databuf[0x7fb] = '\x10';
  databuf[0x7fc] = '\0';
  databuf[0x7fd] = '\0';
  OutputSettings.v = 0;
  memset(pMT->szCfgFilePath,0,0x100);
  sprintf(pMT->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(reqconfigurationbuf + 2,0,0x100);
    memset(pMT->szDevPath,0,0x100);
    sprintf(pMT->szDevPath,"COM1");
    pMT->BaudRate = 0x1c200;
    pMT->timeout = 1000;
    pMT->threadperiod = 0x32;
    pMT->bSaveRawData = 1;
    pMT->bLegacyMode = 1;
    pMT->rollorientation = 0.0;
    pMT->rollp1 = 0.0;
    pMT->rollp2 = 0.0;
    pMT->pitchorientation = 0.0;
    pMT->pitchp1 = 0.0;
    pMT->pitchp2 = 0.0;
    pMT->yaworientation = 0.0;
    pMT->yawp1 = 0.0;
    pMT->yawp2 = 0.0;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      printf("Configuration file not found.\n");
    }
    else {
      pcVar2 = fgets3((FILE *)__stream,(char *)(reqconfigurationbuf + 2),0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(reqconfigurationbuf + 2,"%255s",pMT->szDevPath);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,(char *)(reqconfigurationbuf + 2),0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(reqconfigurationbuf + 2,"%d",&pMT->BaudRate);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,(char *)(reqconfigurationbuf + 2),0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(reqconfigurationbuf + 2,"%d",&pMT->timeout);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,(char *)(reqconfigurationbuf + 2),0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(reqconfigurationbuf + 2,"%d",&pMT->threadperiod);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,(char *)(reqconfigurationbuf + 2),0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(reqconfigurationbuf + 2,"%d",&pMT->bSaveRawData);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,(char *)(reqconfigurationbuf + 2),0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(reqconfigurationbuf + 2,"%d",&pMT->bLegacyMode);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,(char *)(reqconfigurationbuf + 2),0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(reqconfigurationbuf + 2,"%lf",&pMT->rollorientation);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,(char *)(reqconfigurationbuf + 2),0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(reqconfigurationbuf + 2,"%lf",&pMT->rollp1);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,(char *)(reqconfigurationbuf + 2),0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(reqconfigurationbuf + 2,"%lf",&pMT->rollp2);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,(char *)(reqconfigurationbuf + 2),0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(reqconfigurationbuf + 2,"%lf",&pMT->pitchorientation);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,(char *)(reqconfigurationbuf + 2),0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(reqconfigurationbuf + 2,"%lf",&pMT->pitchp1);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,(char *)(reqconfigurationbuf + 2),0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(reqconfigurationbuf + 2,"%lf",&pMT->pitchp2);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,(char *)(reqconfigurationbuf + 2),0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(reqconfigurationbuf + 2,"%lf",&pMT->yaworientation);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,(char *)(reqconfigurationbuf + 2),0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(reqconfigurationbuf + 2,"%lf",&pMT->yawp1);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)__stream,(char *)(reqconfigurationbuf + 2),0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(reqconfigurationbuf + 2,"%lf",&pMT->yawp2);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = fclose(__stream);
      if (iVar1 != 0) {
        printf("fclose() failed.\n");
      }
    }
  }
  if (pMT->threadperiod < 0) {
    printf("Invalid parameter : threadperiod.\n");
    pMT->threadperiod = 0x32;
  }
  memset(&pMT->LastMTData,0,0x130);
  iVar1 = OpenRS232Port(&pMT->RS232Port,pMT->szDevPath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(&pMT->RS232Port,pMT->BaudRate,'\0',0,'\b','\x02',pMT->timeout);
    if (iVar1 == 0) {
      SetMTChecksum(gotomeasurementbuf + 2,5);
      iVar1 = WriteAllRS232Port(&pMT->RS232Port,gotomeasurementbuf + 2,5);
      if (iVar1 == 0) {
        memset(local_938,0,0x800);
        OutputSettings.v = 0;
        iVar1 = GetLatestMTMessageMT(pMT,0xff,0x31,local_938,0x800,(int *)&OutputSettings.v);
        if (iVar1 == 0) {
          SetMTChecksum(databuf + 0x7fe,5);
          iVar1 = WriteAllRS232Port(&pMT->RS232Port,databuf + 0x7fe,5);
          if (iVar1 == 0) {
            memset(local_938,0,0x800);
            OutputSettings.v = 0;
            iVar1 = GetLatestMTMessageMT(pMT,0xff,0xd,local_938,0x800,(int *)&OutputSettings.v);
            if (iVar1 == 0) {
              local_93e = CONCAT11(databuf[0x60],databuf[0x61]);
              local_944 = CONCAT13(databuf[0x62],
                                   CONCAT12(databuf[99],CONCAT11(databuf[100],databuf[0x65])));
              pMT->OutputMode = (uint)local_93e;
              pMT->OutputSettings = local_944;
              SetMTChecksum(databuf + 0x7f9,5);
              iVar1 = WriteAllRS232Port(&pMT->RS232Port,databuf + 0x7f9,5);
              if (iVar1 == 0) {
                memset(local_938,0,0x800);
                OutputSettings.v = 0;
                iVar1 = GetLatestMTMessageMT(pMT,0xff,0x11,local_938,0x800,(int *)&OutputSettings.v)
                ;
                if (iVar1 == 0) {
                  printf("MT connected.\n");
                  pMT_local._4_4_ = 0;
                }
                else {
                  printf("Unable to connect to a MT : Initialization failure.\n");
                  CloseRS232Port(&pMT->RS232Port);
                  pMT_local._4_4_ = 1;
                }
              }
              else {
                printf("Unable to connect to a MT : Initialization failure.\n");
                CloseRS232Port(&pMT->RS232Port);
                pMT_local._4_4_ = 1;
              }
            }
            else {
              printf("Unable to connect to a MT : Initialization failure.\n");
              CloseRS232Port(&pMT->RS232Port);
              pMT_local._4_4_ = 1;
            }
          }
          else {
            printf("Unable to connect to a MT : Initialization failure.\n");
            CloseRS232Port(&pMT->RS232Port);
            pMT_local._4_4_ = 1;
          }
        }
        else {
          printf("Unable to connect to a MT : Initialization failure.\n");
          CloseRS232Port(&pMT->RS232Port);
          pMT_local._4_4_ = 1;
        }
      }
      else {
        printf("Unable to connect to a MT : Initialization failure.\n");
        CloseRS232Port(&pMT->RS232Port);
        pMT_local._4_4_ = 1;
      }
    }
    else {
      printf("Unable to connect to a MT.\n");
      CloseRS232Port(&pMT->RS232Port);
      pMT_local._4_4_ = 1;
    }
  }
  else {
    printf("Unable to connect to a MT.\n");
    pMT_local._4_4_ = 1;
  }
  return pMT_local._4_4_;
}

Assistant:

inline int ConnectMT(MT* pMT, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	unsigned char gotoconfigbuf[] = {PREAMBLE_MT,ADDR_MT,GO_TO_CONFIG_MID,0x00,0x00};
	unsigned char reqconfigurationbuf[] = {PREAMBLE_MT,ADDR_MT,REQ_CONFIGURATION_MID,0x00,0x00};
	unsigned char gotomeasurementbuf[] = {PREAMBLE_MT,ADDR_MT,GO_TO_MEASUREMENT_MID,0x00,0x00};
	unsigned char databuf[MAX_NB_BYTES_MT];
	int nbdatabytes = 0;
	uShort_MT OutputMode;
	uInt_MT OutputSettings;

	memset(pMT->szCfgFilePath, 0, sizeof(pMT->szCfgFilePath));
	sprintf(pMT->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pMT->szDevPath, 0, sizeof(pMT->szDevPath));
		sprintf(pMT->szDevPath, "COM1");
		pMT->BaudRate = 115200;
		pMT->timeout = 1000;
		pMT->threadperiod = 50;
		pMT->bSaveRawData = 1;
		pMT->bLegacyMode = 1;
		pMT->rollorientation = 0;
		pMT->rollp1 = 0;
		pMT->rollp2 = 0;
		pMT->pitchorientation = 0;
		pMT->pitchp1 = 0;
		pMT->pitchp2 = 0;
		pMT->yaworientation = 0;
		pMT->yawp1 = 0;
		pMT->yawp2 = 0;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pMT->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMT->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMT->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMT->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMT->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMT->bLegacyMode) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pMT->rollorientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pMT->rollp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pMT->rollp2) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pMT->pitchorientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pMT->pitchp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pMT->pitchp2) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pMT->yaworientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pMT->yawp1) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pMT->yawp2) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pMT->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pMT->threadperiod = 50;
	}

	// Used to save raw data, should be handled specifically...
	//pMT->pfSaveFile = NULL;

	memset(&pMT->LastMTData, 0, sizeof(MTDATA));

	if (OpenRS232Port(&pMT->RS232Port, pMT->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MT.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pMT->RS232Port, pMT->BaudRate, NOPARITY, FALSE, 8, 
		TWOSTOPBITS, (UINT)pMT->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MT.\n");
		CloseRS232Port(&pMT->RS232Port);
		return EXIT_FAILURE;
	}

	// Go to configuration state.
	SetMTChecksum(gotoconfigbuf, sizeof(gotoconfigbuf));
	if (WriteAllRS232Port(&pMT->RS232Port, gotoconfigbuf, sizeof(gotoconfigbuf)) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MT : Initialization failure.\n");
		CloseRS232Port(&pMT->RS232Port);
		return EXIT_FAILURE;
	}

	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMTMessageMT(pMT, ADDR_MT, GO_TO_CONFIG_ACK_MID, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		printf("Unable to connect to a MT : Initialization failure.\n");
		CloseRS232Port(&pMT->RS232Port);
		return EXIT_FAILURE;	
	}

	// Request the current configuration.
	SetMTChecksum(reqconfigurationbuf, sizeof(reqconfigurationbuf));
	if (WriteAllRS232Port(&pMT->RS232Port, reqconfigurationbuf, sizeof(reqconfigurationbuf)) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MT : Initialization failure.\n");
		CloseRS232Port(&pMT->RS232Port);
		return EXIT_FAILURE;
	}

	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMTMessageMT(pMT, ADDR_MT, CONFIGURATION_MID, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		printf("Unable to connect to a MT : Initialization failure.\n");
		CloseRS232Port(&pMT->RS232Port);
		return EXIT_FAILURE;	
	}

	// Analyze the configuration returned.
	OutputMode.c[0] = databuf[105];
	OutputMode.c[1] = databuf[104];
	OutputSettings.c[0] = databuf[109];
	OutputSettings.c[1] = databuf[108];
	OutputSettings.c[2] = databuf[107];
	OutputSettings.c[3] = databuf[106];

	pMT->OutputMode = OutputMode.v;
	pMT->OutputSettings = OutputSettings.v;

	// Go to measurement state.
	SetMTChecksum(gotomeasurementbuf, sizeof(gotomeasurementbuf));
	if (WriteAllRS232Port(&pMT->RS232Port, gotomeasurementbuf, sizeof(gotomeasurementbuf)) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MT : Initialization failure.\n");
		CloseRS232Port(&pMT->RS232Port);
		return EXIT_FAILURE;
	}

	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMTMessageMT(pMT, ADDR_MT, GO_TO_MEASUREMENT_ACK_MID, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		printf("Unable to connect to a MT : Initialization failure.\n");
		CloseRS232Port(&pMT->RS232Port);
		return EXIT_FAILURE;	
	}

	printf("MT connected.\n");

	return EXIT_SUCCESS;
}